

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

shared_ptr<kratos::AssignStmt> __thiscall
kratos::EnumVar::assign_(EnumVar *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  allocator<const_kratos::IRNode_*> *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  bool bVar1;
  uint uVar2;
  VarType VVar3;
  element_type *peVar4;
  VarException *pVVar5;
  element_type *this_01;
  Enum *pEVar6;
  element_type *peVar7;
  InternalException *this_02;
  long lVar8;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  undefined4 in_register_00000014;
  char (*format_str) [82];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::AssignStmt> sVar9;
  format_args args;
  string_view format_str_00;
  undefined8 *local_310;
  allocator<const_kratos::IRNode_*> local_2a1;
  IRNode *local_2a0;
  element_type *local_298;
  iterator local_290;
  size_type local_288;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_280;
  allocator<char> local_261;
  string local_260;
  undefined1 local_23a;
  allocator<const_kratos::IRNode_*> local_239;
  element_type *local_238;
  element_type **local_230;
  size_type local_228;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_220;
  v7 local_208 [32];
  string local_1e8;
  undefined1 local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  undefined8 *local_1a0;
  EnumType *p_1;
  IRNode *local_190;
  element_type *local_188;
  iterator local_180;
  size_type local_178;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_170;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [8];
  shared_ptr<kratos::EnumConst> p;
  IRNode *local_118;
  element_type *local_110;
  iterator local_108;
  size_type local_100;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_f8;
  allocator<char> local_c9;
  string local_c8;
  undefined4 local_a4;
  undefined8 uStack_a0;
  AssignmentType type_local;
  shared_ptr<kratos::Var> *var_local;
  EnumVar *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  __node_base local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  uStack_a0 = CONCAT44(in_register_00000014,type);
  local_a4 = SUB84(in_RCX,0);
  var_local = var;
  this_local = this;
  peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      uStack_a0);
  uVar2 = (*(peVar4->super_IRNode)._vptr_IRNode[0x1a])();
  if ((uVar2 & 1) == 0) {
    p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
    pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Cannot assign enum type to non enum type",&local_c9);
    local_118 = (IRNode *)var;
    local_110 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)uStack_a0);
    local_108 = &local_118;
    local_100 = 2;
    this_00 = (allocator<const_kratos::IRNode_*> *)
              ((long)&p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7);
    std::allocator<const_kratos::IRNode_*>::allocator(this_00);
    __l_02._M_len = local_100;
    __l_02._M_array = local_108;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_f8,__l_02,this_00);
    VarException::VarException(pVVar5,&local_c8,&local_f8);
    p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
    __cxa_throw(pVVar5,&VarException::typeinfo,VarException::~VarException);
  }
  peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      uStack_a0);
  VVar3 = Var::type(peVar4);
  if (VVar3 == ConstValue) {
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               uStack_a0);
    Var::as<kratos::EnumConst>((Var *)local_130);
    this_01 = std::__shared_ptr_access<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_130);
    pEVar6 = EnumConst::enum_def(this_01);
    bVar1 = std::operator!=(&pEVar6->name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
    if (bVar1) {
      p_1._6_1_ = 1;
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Cannot assign different enum type",&local_151);
      local_190 = (IRNode *)var;
      local_188 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)uStack_a0);
      local_180 = &local_190;
      local_178 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)((long)&p_1 + 7));
      __l_01._M_len = local_178;
      __l_01._M_array = local_180;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_170,__l_01,(allocator<const_kratos::IRNode_*> *)((long)&p_1 + 7));
      VarException::VarException(pVVar5,&local_150,&local_170);
      p_1._6_1_ = 0;
      __cxa_throw(pVVar5,&VarException::typeinfo,VarException::~VarException);
    }
    std::shared_ptr<kratos::EnumConst>::~shared_ptr((shared_ptr<kratos::EnumConst> *)local_130);
  }
  else {
    peVar7 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)uStack_a0);
    if (peVar7 == (element_type *)0x0) {
      local_310 = (undefined8 *)0x0;
    }
    else {
      in_RCX = (remove_reference_t<std::__cxx11::basic_string<char>_> *)0xfffffffffffffffe;
      local_310 = (undefined8 *)__dynamic_cast(peVar7,&Var::typeinfo,&EnumType::typeinfo);
    }
    local_1a0 = local_310;
    if (local_310 == (undefined8 *)0x0) {
      local_1c2 = 1;
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"Unable to obtain enum definition",&local_1c1);
      InternalException::InternalException(this_02,&local_1c0);
      local_1c2 = 0;
      __cxa_throw(this_02,&InternalException::typeinfo,InternalException::~InternalException);
    }
    lVar8 = (**(code **)*local_310)();
    if (lVar8 == 0) {
      local_23a = 1;
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)uStack_a0);
      (*(peVar4->super_IRNode)._vptr_IRNode[0x20])(local_208);
      local_38 = &local_1e8;
      local_40 = 
      "Cannot obtain enum information from var ({0}). Please use a cast if it\'s intended";
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_208;
      local_68.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string,char[82],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)
                      "Cannot obtain enum information from var ({0}). Please use a cast if it\'s intended"
                      ,(v7 *)vargs,format_str,in_RCX);
      local_50 = &local_68;
      local_78 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28._M_nxt = (_Hash_node_base *)&local_88;
      local_30 = local_50;
      local_20 = local_50;
      local_10 = local_50;
      local_18 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)local_28._M_nxt;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_28._M_nxt,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_50->string);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_88.field_1.values_;
      format_str_00.size_ = local_88.desc_;
      format_str_00.data_ = (char *)local_78.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_1e8,(detail *)local_78.data_,format_str_00,args);
      local_238 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)uStack_a0);
      local_230 = &local_238;
      local_228 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_239);
      __l_00._M_len = local_228;
      __l_00._M_array = (iterator)local_230;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_220,__l_00,&local_239);
      VarException::VarException(pVVar5,&local_1e8,&local_220);
      local_23a = 0;
      __cxa_throw(pVVar5,&VarException::typeinfo,VarException::~VarException);
    }
    lVar8 = (**(code **)*local_1a0)();
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar8 + 0x40),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
    if (bVar1) {
      pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"Cannot assign different enum type",&local_261);
      local_2a0 = (IRNode *)var;
      local_298 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)uStack_a0);
      local_290 = &local_2a0;
      local_288 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_2a1);
      __l._M_len = local_288;
      __l._M_array = local_290;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_280,__l,&local_2a1);
      VarException::VarException(pVVar5,&local_260,&local_280);
      __cxa_throw(pVVar5,&VarException::typeinfo,VarException::~VarException);
    }
  }
  sVar9 = Var::assign_(&this->super_Var,var,(AssignmentType)uStack_a0);
  sVar9.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar9.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> EnumVar::assign_(const std::shared_ptr<Var> &var,
                                             kratos::AssignmentType type) {
    if (!var->is_enum())
        throw VarException("Cannot assign enum type to non enum type", {this, var.get()});
    if (var->type() == VarType::ConstValue) {
        auto p = var->as<EnumConst>();
        if (p->enum_def()->name != enum_type_->name)
            throw VarException("Cannot assign different enum type", {this, var.get()});
    } else {
        auto *p = dynamic_cast<EnumType *>(var.get());
        if (!p) throw InternalException("Unable to obtain enum definition");
        if (!p->enum_type())
            throw VarException(::format("Cannot obtain enum information from var ({0}). "
                                        "Please use a cast if it's intended",
                                        var->handle_name()),
                               {var.get()});
        if (p->enum_type()->name != enum_type_->name) {
            throw VarException("Cannot assign different enum type", {this, var.get()});
        }
    }
    return Var::assign_(var, type);
}